

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_content_access<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>,unsigned_int>
               (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  uint uVar1;
  _Rb_tree_const_iterator<unsigned_int> __first1;
  bool bVar2;
  _Bit_type *p_Var3;
  List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  *pLVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __first2;
  vector<bool,_std::allocator<bool>_> container;
  undefined **local_228;
  ulong local_220;
  shared_count sStack_218;
  size_t **local_210;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_208;
  _Rb_tree_node_base local_1d8;
  char *local_1b8;
  char *local_1b0;
  shared_count sStack_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            ((column_content<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>
              *)&local_208,col);
  if (local_208._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    __first1._M_node._4_4_ = local_208._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
    __first1._M_node._0_4_ = (uint)local_208._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                      (__first1,(_Base_ptr)((long)&local_208 + 8),
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_1d8._M_color._0_1_ = bVar2;
  local_1d8._M_parent = (_Base_ptr)0x0;
  local_1d8._M_left = (_Base_ptr)0x0;
  local_1b8 = "get_column_content_via_iterators(col) == setcont";
  local_1b0 = "";
  local_220 = local_220 & 0xffffffffffffff00;
  local_228 = &PTR__lazy_ostream_00197830;
  sStack_218.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_210 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8._M_left);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_208);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar5 = (*(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          *(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
          (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar5 < 0) {
    if ((col->column_).
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
        ._M_impl._M_node._M_size == 0) {
      local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_208._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
      local_208._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
      local_208._M_impl._0_8_ = (_Bit_type *)0x0;
      local_208._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_208._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      goto LAB_00130edb;
    }
    uVar5 = *(int *)&((col->column_).
                      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next + 1;
  }
  local_228 = (undefined **)((ulong)local_228 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_208,(long)(int)uVar5,(bool *)&local_228,
             (allocator_type *)&local_1b8);
  pLVar4 = (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
            *)(col->column_).
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
  while ((pLVar4 != col &&
         (uVar1 = *(uint *)(pLVar4->column_).
                           super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                           ._M_impl._M_node._M_size, uVar1 < uVar5))) {
    *(ulong *)(local_208._M_impl._0_8_ + (ulong)(uVar1 >> 6) * 8) =
         *(ulong *)(local_208._M_impl._0_8_ + (ulong)(uVar1 >> 6) * 8) | 1L << ((byte)uVar1 & 0x3f);
    pLVar4 = (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *)(pLVar4->column_).
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
  }
LAB_00130edb:
  __last1.super__Bit_iterator_base._M_offset =
       (uint)local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  __last1.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_208._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(uint)local_208._M_impl.super__Rb_tree_header._M_header._M_left +
      ((long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent - local_208._M_impl._0_8_)
      * 8 == (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3)
             * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_208._M_impl._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = p_Var3;
    bVar2 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1,__first2);
  }
  else {
    bVar2 = false;
  }
  local_1d8._M_color._0_1_ = bVar2;
  local_1d8._M_parent = (_Base_ptr)0x0;
  local_1d8._M_left = (_Base_ptr)0x0;
  local_1b8 = "col.get_content(veccont.size()) == veccont";
  local_1b0 = "";
  local_220 = local_220 & 0xffffffffffffff00;
  local_228 = &PTR__lazy_ostream_00197830;
  sStack_218.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_210 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_228,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8._M_left);
  if ((_Bit_type *)local_208._M_impl._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_208._M_impl._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_1d8._M_parent = (_Base_ptr)((ulong)local_1d8._M_parent & 0xffffffffffffff00);
  local_1d8._0_8_ = &PTR__lazy_ostream_001977f0;
  local_1d8._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1d8._M_right = (_Base_ptr)0x176177;
  local_138 = (col->column_).
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
              ._M_impl._M_node._M_size;
  local_128 = &local_138;
  local_140 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8 = (char *)CONCAT71(local_1b8._1_7_,local_138 == local_140);
  local_130 = &local_140;
  local_1b0 = (char *)0x0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_208._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_208._M_impl._0_8_ = &PTR__lazy_ostream_00197760;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_210 = &local_130;
  local_220 = local_220 & 0xffffffffffffff00;
  local_228 = &PTR__lazy_ostream_00197760;
  sStack_218.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  if (((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_228 = (undefined **)
                CONCAT71(local_228._1_7_,
                         (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                          *)(col->column_).
                            super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                            ._M_impl._M_node.super__List_node_base._M_next == col);
    local_220 = 0;
    sStack_218.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "col.is_empty()";
    local_1d8._M_parent = (_Base_ptr)0x17a20d;
    local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_208._M_impl._0_8_ = &PTR__lazy_ostream_00197830;
    local_208._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_208._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_228 = (undefined **)
                CONCAT71(local_228._1_7_,
                         (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                          *)(col->column_).
                            super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                            ._M_impl._M_node.super__List_node_base._M_next != col);
    local_220 = 0;
    sStack_218.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "!col.is_empty()";
    local_1d8._M_parent = (_Base_ptr)0x17a20d;
    local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_208._M_impl._0_8_ = &PTR__lazy_ostream_00197830;
    local_208._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_208._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x17626c;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_218);
  p_Var3 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) * 8 +
      (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar7 = 0;
    do {
      iVar6 = (int)uVar7;
      if ((p_Var3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        pLVar4 = col;
        do {
          pLVar4 = (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                    *)(pLVar4->column_).
                      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
          if (pLVar4 == col) break;
        } while (*(int *)(pLVar4->column_).
                         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                         ._M_impl._M_node._M_size != iVar6);
        local_228 = (undefined **)CONCAT71(local_228._1_7_,pLVar4 == col);
        local_220 = 0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_1d8._0_8_ = "!col.is_non_zero(i)";
        local_1d8._M_parent = (_Base_ptr)0x17a221;
        local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_208._M_impl._0_8_ = &PTR__lazy_ostream_00197830;
        local_208._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_208._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        boost::test_tools::tt_detail::report_assertion(&local_228,&local_208,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        pLVar4 = col;
        do {
          pLVar4 = (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                    *)(pLVar4->column_).
                      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
          if (pLVar4 == col) break;
        } while (*(int *)(pLVar4->column_).
                         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                         ._M_impl._M_node._M_size != iVar6);
        local_228 = (undefined **)CONCAT71(local_228._1_7_,pLVar4 != col);
        local_220 = 0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_1d8._0_8_ = "col.is_non_zero(i)";
        local_1d8._M_parent = (_Base_ptr)0x17a221;
        local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_208._M_impl._0_8_ = &PTR__lazy_ostream_00197830;
        local_208._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_208._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_198 = "";
        boost::test_tools::tt_detail::report_assertion(&local_228,&local_208,&local_1a0,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_218);
      uVar7 = (ulong)(iVar6 + 1);
      p_Var3 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while (uVar7 < (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var3) * 8);
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}